

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O0

void refLib(void)

{
  FontRendererError *this;
  undefined1 local_50 [32];
  string local_30 [36];
  int local_c;
  FT_Error err;
  
  libRefCount = libRefCount + 1;
  if ((libRefCount < 2) && (local_c = FT_Init_FreeType(&library), local_c != 0)) {
    this = (FontRendererError *)__cxa_allocate_exception(0x10);
    ftErrorToStr_abi_cxx11_((FT_Error)local_50);
    std::operator+((char *)local_30,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Error initializing FreeType: ");
    dpfb::FontRendererError::runtime_error(this,local_30);
    __cxa_throw(this,&dpfb::FontRendererError::typeinfo,dpfb::FontRendererError::~FontRendererError)
    ;
  }
  return;
}

Assistant:

static void refLib()
{
    ++libRefCount;
    if (libRefCount > 1)
        return;

    auto err = FT_Init_FreeType(&library);
    if (err != FT_Err_Ok)
        throw dpfb::FontRendererError(
            "Error initializing FreeType: " + ftErrorToStr(err));
}